

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::CodeHolder::copyFlattenedData
          (CodeHolder *this,void *dst,size_t dstSize,CopySectionFlags copyFlags)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong __n;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t __n_00;
  Error EVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar1 = *(uint *)&this->field_0xf0;
  bVar11 = (ulong)uVar1 == 0;
  if (bVar11) {
    uVar6 = 0;
  }
  else {
    lVar2 = *(long *)&this->_sectionsByOrder;
    lVar7 = 0;
    uVar6 = 0;
    do {
      lVar3 = *(long *)(lVar2 + lVar7);
      uVar10 = *(ulong *)(lVar3 + 0x10);
      uVar8 = dstSize - uVar10;
      if ((dstSize < uVar10) || (__n = *(ulong *)(lVar3 + 0x50), uVar8 < __n)) {
        bVar5 = false;
      }
      else {
        memcpy((void *)((long)dst + uVar10),*(void **)(lVar3 + 0x48),__n);
        if (((copyFlags & kPadSectionBuffer) == kNone) ||
           (uVar4 = *(ulong *)(lVar3 + 0x18), uVar4 <= __n)) {
          __n_00 = 0;
        }
        else {
          if (uVar4 < uVar8) {
            uVar8 = uVar4;
          }
          __n_00 = uVar8 - __n;
          memset((void *)((long)((long)dst + uVar10) + __n),0,__n_00);
        }
        uVar10 = __n + uVar10 + __n_00;
        if (uVar6 <= uVar10) {
          uVar6 = uVar10;
        }
        bVar5 = true;
      }
      if (!bVar5) break;
      lVar7 = lVar7 + 8;
      bVar11 = (ulong)uVar1 << 3 == lVar7;
    } while (!bVar11);
  }
  EVar9 = 2;
  if (bVar11) {
    EVar9 = 0;
    if (((copyFlags & kPadTargetBuffer) != kNone) &&
       (EVar9 = 0, uVar6 <= dstSize && dstSize - uVar6 != 0)) {
      EVar9 = 0;
      memset((void *)((long)dst + uVar6),0,dstSize - uVar6);
    }
  }
  return EVar9;
}

Assistant:

Error CodeHolder::copyFlattenedData(void* dst, size_t dstSize, CopySectionFlags copyFlags) noexcept {
  size_t end = 0;
  for (Section* section : _sectionsByOrder) {
    if (section->offset() > dstSize)
      return DebugUtils::errored(kErrorInvalidArgument);

    size_t bufferSize = section->bufferSize();
    size_t offset = size_t(section->offset());

    if (ASMJIT_UNLIKELY(dstSize - offset < bufferSize))
      return DebugUtils::errored(kErrorInvalidArgument);

    uint8_t* dstTarget = static_cast<uint8_t*>(dst) + offset;
    size_t paddingSize = 0;
    memcpy(dstTarget, section->data(), bufferSize);

    if (Support::test(copyFlags, CopySectionFlags::kPadSectionBuffer) && bufferSize < section->virtualSize()) {
      paddingSize = Support::min<size_t>(dstSize - offset, size_t(section->virtualSize())) - bufferSize;
      memset(dstTarget + bufferSize, 0, paddingSize);
    }

    end = Support::max(end, offset + bufferSize + paddingSize);
  }

  if (end < dstSize && Support::test(copyFlags, CopySectionFlags::kPadTargetBuffer)) {
    memset(static_cast<uint8_t*>(dst) + end, 0, dstSize - end);
  }

  return kErrorOk;
}